

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O1

QRect __thiscall QSystemTrayIconSys::globalGeometry(QSystemTrayIconSys *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp.m_i = 0;
  local_18.yp.m_i = 0;
  QVar2._0_8_ = QWidget::mapToGlobal((QWidget *)this,&local_18);
  lVar1 = *(long *)(this + 0x20);
  QVar2.x2.m_i = (*(int *)(lVar1 + 0x1c) + QVar2.x1.m_i.m_i) - *(int *)(lVar1 + 0x14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    QVar2.y2.m_i = (QVar2.y1.m_i.m_i + *(int *)(lVar1 + 0x20)) - *(int *)(lVar1 + 0x18);
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QSystemTrayIconSys::globalGeometry() const
{
    return QRect(mapToGlobal(QPoint(0, 0)), size());
}